

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::InitAllocated
          (ArenaStringPtr *this,string *str,Arena *arena)

{
  if (arena == (Arena *)0x0) {
    TaggedStringPtr::SetAllocated(&this->tagged_ptr_,str);
    return;
  }
  TaggedStringPtr::SetMutableArena(&this->tagged_ptr_,str);
  if (str != (string *)0x0) {
    ThreadSafeArena::AddCleanup(&arena->impl_,str,arena_delete_object<std::__cxx11::string>);
    return;
  }
  return;
}

Assistant:

inline void ArenaStringPtr::InitAllocated(std::string* str, Arena* arena) {
  if (arena != nullptr) {
    tagged_ptr_.SetMutableArena(str);
    arena->Own(str);
  } else {
    tagged_ptr_.SetAllocated(str);
  }
}